

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&>::operator!=
          (result *__return_storage_ptr__,
          expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          char (*rhs) [6])

{
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  char (*in_R8) [6];
  allocator<char> local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88 [2];
  string local_68;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_48;
  size_t local_38;
  char *pcStack_30;
  bool local_21;
  string *local_20;
  char (*rhs_local) [6];
  expression_lhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  local_38 = **(size_t **)this;
  pcStack_30 = (char *)(*(size_t **)this)[1];
  local_20 = (string *)rhs;
  rhs_local = (char (*) [6])this;
  this_local = (expression_lhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
               __return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*rhs);
  __x._M_str = pcStack_30;
  __x._M_len = local_38;
  local_21 = std::operator!=(__x,local_48);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"!=",&local_89);
  to_string<std::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_68,this_00,local_88,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }